

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

bool duckdb::AllConflictsMeetCondition(DataChunk *result)

{
  ulong uVar1;
  ulong uVar2;
  reference pvVar3;
  ulong uVar4;
  bool bVar5;
  
  DataChunk::Flatten(result);
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
  uVar1 = result->count;
  if (uVar1 == 0) {
    bVar5 = true;
  }
  else if (*pvVar3->data == '\x01') {
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      if (uVar1 == uVar4) break;
      uVar2 = uVar4 + 1;
    } while (pvVar3->data[uVar4] != '\0');
    bVar5 = uVar1 <= uVar4;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool AllConflictsMeetCondition(DataChunk &result) {
	result.Flatten();
	auto data = FlatVector::GetData<bool>(result.data[0]);
	for (idx_t i = 0; i < result.size(); i++) {
		if (!data[i]) {
			return false;
		}
	}
	return true;
}